

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O3

vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *
vk::enumerateDeviceLayerProperties
          (vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice)

{
  VkResult VVar1;
  TestError *this;
  deUint32 numLayers;
  uint local_1c;
  
  (__return_storage_ptr__->
  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c = 0;
  VVar1 = (*vki->_vptr_InstanceInterface[0xb])(vki,physicalDevice,&local_1c,0);
  checkResult(VVar1,"vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xd3);
  if ((ulong)local_1c != 0) {
    std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::resize
              (__return_storage_ptr__,(ulong)local_1c);
    VVar1 = (*vki->_vptr_InstanceInterface[0xb])
                      (vki,physicalDevice,&local_1c,
                       (__return_storage_ptr__->
                       super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    checkResult(VVar1,
                "vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, &properties[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,0xd8);
    if (((long)(__return_storage_ptr__->
               super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(__return_storage_ptr__->
               super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>).
               _M_impl.super__Vector_impl_data._M_start >> 3) * 0xfc0fc0fc0fc0fc1 - (ulong)local_1c
        != 0) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,(char *)0x0,"(size_t)numLayers == properties.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0xd9);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkLayerProperties> enumerateDeviceLayerProperties (const InstanceInterface& vki, VkPhysicalDevice physicalDevice)
{
	vector<VkLayerProperties>	properties;
	deUint32					numLayers	= 0;

	VK_CHECK(vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, DE_NULL));

	if (numLayers > 0)
	{
		properties.resize(numLayers);
		VK_CHECK(vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, &properties[0]));
		TCU_CHECK((size_t)numLayers == properties.size());
	}

	return properties;
}